

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

void __thiscall Clasp::Solver::resetHeuristic(Solver *this,Solver *s,DecisionHeuristic *h,Type t)

{
  ulong uVar1;
  unsigned_long __tmp;
  undefined **ppuVar2;
  long *plVar3;
  
  if ((s != (Solver *)0x0) &&
     (plVar3 = (long *)((this->heuristic_).ptr_ & 0xfffffffffffffffe), plVar3 != (long *)0x0)) {
    (**(code **)(*plVar3 + 0x20))(plVar3,this);
  }
  ppuVar2 = &null_heuristic_g;
  if (h != (DecisionHeuristic *)0x0) {
    ppuVar2 = (undefined **)h;
  }
  uVar1 = (this->heuristic_).ptr_;
  (this->heuristic_).ptr_ = (ulong)(t == Acquire && h != (DecisionHeuristic *)0x0) | (ulong)ppuVar2;
  plVar3 = (long *)(uVar1 & 0xfffffffffffffffe);
  if ((uVar1 & 1) != 0 && plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
    return;
  }
  return;
}

Assistant:

void Solver::resetHeuristic(Solver* s, DecisionHeuristic* h, Ownership_t::Type t) {
	if (s && heuristic_.get()) { heuristic_->detach(*this); }
	if (!h) { h = &null_heuristic_g; t = Ownership_t::Retain; }
	HeuristicPtr(h, t).swap(heuristic_);
}